

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O2

ComponentHandle<Tag,_entityx::EntityManager> __thiscall
entityx::EntityManager::assign<Tag,char_const(&)[4]>(EntityManager *this,Id id,char (*args) [4])

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ComponentHandle<Tag,_entityx::EntityManager> CVar4;
  Family __position;
  Pool<Tag,_8192UL> *pPVar5;
  ulong uVar6;
  Entity local_70;
  string local_60 [32];
  ComponentHandle<Tag,_entityx::EntityManager> component;
  
  __position = Component<Tag>::family();
  pPVar5 = accomodate_component<Tag>(this);
  uVar6 = id.id_ & 0xffffffff;
  uVar1 = *(ulong *)&pPVar5->field_0x28;
  lVar2 = *(long *)&pPVar5->field_0x20;
  lVar3 = *(long *)(*(long *)&pPVar5->field_0x8 + (uVar6 / uVar1) * 8);
  std::__cxx11::string::string(local_60,*args,(allocator *)&local_70);
  std::__cxx11::string::string((string *)((uVar6 % uVar1) * lVar2 + lVar3),local_60);
  std::__cxx11::string::~string(local_60);
  Catch::clara::std::bitset<64UL>::set
            ((bitset<64UL> *)(uVar6 * 8 + *(long *)(this + 0x48)),__position,true);
  local_70.manager_ = this;
  local_70.id_.id_ = id.id_;
  component.manager_ = this;
  component.id_.id_ = id.id_;
  EventManager::
  emit<entityx::ComponentAddedEvent<Tag>,entityx::Entity,entityx::ComponentHandle<Tag,entityx::EntityManager>&>
            (*(EventManager **)(this + 0x10),&local_70,&component);
  CVar4.id_.id_ = component.id_.id_;
  CVar4.manager_ = component.manager_;
  return CVar4;
}

Assistant:

ComponentHandle<C> assign(Entity::Id id, Args && ... args) {
    assert_valid(id);
    const BaseComponent::Family family = component_family<C>();
    assert(!entity_component_mask_[id.index()].test(family));

    // Placement new into the component pool.
    Pool<C> *pool = accomodate_component<C>();
    ::new(pool->get(id.index())) C(std::forward<Args>(args) ...);

    // Set the bit for this component.
    entity_component_mask_[id.index()].set(family);

    // Create and return handle.
    ComponentHandle<C> component(this, id);
    event_manager_.emit<ComponentAddedEvent<C>>(Entity(this, id), component);
    return component;
  }